

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O1

REF_STATUS
ref_agents_pop(REF_AGENTS ref_agents,REF_INT *node,REF_INT *part,REF_INT *seed,REF_DBL *xyz)

{
  int id;
  REF_AGENT_STRUCT *pRVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  id = ref_agents->last;
  lVar4 = (long)id;
  if (lVar4 == -1) {
    uVar2 = 5;
  }
  else {
    pRVar1 = ref_agents->agent;
    *node = pRVar1[lVar4].node;
    *part = pRVar1[lVar4].part;
    *seed = pRVar1[lVar4].seed;
    lVar3 = 0;
    do {
      xyz[lVar3] = pRVar1[lVar4].xyz[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    uVar2 = ref_agents_remove(ref_agents,id);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0xdc
             ,"ref_agents_pop",(ulong)uVar2,"rm");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_agents_pop(REF_AGENTS ref_agents, REF_INT *node,
                                  REF_INT *part, REF_INT *seed, REF_DBL *xyz) {
  REF_INT i, id;

  if (REF_EMPTY == ref_agents->last) return REF_NOT_FOUND;

  id = ref_agents->last;

  *node = ref_agent_node(ref_agents, id);
  *part = ref_agent_part(ref_agents, id);
  *seed = ref_agent_seed(ref_agents, id);
  for (i = 0; i < 3; i++) xyz[i] = ref_agent_xyz(ref_agents, i, id);

  RSS(ref_agents_remove(ref_agents, id), "rm");

  return REF_SUCCESS;
}